

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O3

int evutil_parse_sockaddr_port(char *ip_as_string,sockaddr *out,int *outlen)

{
  ushort uVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  size_t __n;
  ulong __n_00;
  char *pcVar5;
  char buf [128];
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  undefined8 uStack_c0;
  char local_b8 [136];
  
  pcVar3 = strchr(ip_as_string,0x3a);
  if (*ip_as_string == '[') {
    pcVar3 = strchr(ip_as_string,0x5d);
    if (pcVar3 == (char *)0x0) {
      return -1;
    }
    pcVar5 = ip_as_string + 1;
    __n_00 = (long)pcVar3 - (long)pcVar5;
    if (0x7f < __n_00) {
      return -1;
    }
    ip_as_string = local_b8;
    memcpy(ip_as_string,pcVar5,__n_00);
    local_b8[__n_00] = '\0';
    if (pcVar3[1] == ':') {
      iVar2 = atoi(pcVar3 + 2);
      if (iVar2 - 0x10000U < 0xffff0001) {
        return -1;
      }
      ip_as_string = local_b8;
    }
    else {
      iVar2 = 0;
    }
LAB_0024f9a1:
    uStack_d0 = 0;
    uStack_cc = 0;
    uStack_c8 = 0;
    uStack_c4 = 0;
    uStack_c0 = 0;
    uVar1 = (ushort)iVar2 << 8 | (ushort)iVar2 >> 8;
    iVar2 = evutil_inet_pton(10,ip_as_string,&uStack_cc);
    iVar4 = -1;
    if ((iVar2 == 1) && (0x1b < (long)*outlen)) {
      iVar4 = 0;
      memset(out[1].sa_data + 10,0,(long)*outlen - 0x1c);
      out->sa_family = 10;
      out->sa_data[0] = (char)uVar1;
      out->sa_data[1] = (char)(uVar1 >> 8);
      out->sa_data[2] = (char)uStack_d0;
      out->sa_data[3] = (char)((uint)uStack_d0 >> 8);
      out->sa_data[4] = (char)((uint)uStack_d0 >> 0x10);
      out->sa_data[5] = (char)((uint)uStack_d0 >> 0x18);
      *(ulong *)(out->sa_data + 6) = CONCAT44(uStack_c8,uStack_cc);
      *(ulong *)(out->sa_data + 10) = CONCAT44(uStack_c4,uStack_c8);
      *(undefined8 *)(out[1].sa_data + 2) = uStack_c0;
      *outlen = 0x1c;
    }
  }
  else {
    if (pcVar3 == (char *)0x0) {
      iVar2 = 0;
    }
    else {
      pcVar5 = strchr(pcVar3 + 1,0x3a);
      if (pcVar5 != (char *)0x0) {
        iVar2 = 0;
        goto LAB_0024f9a1;
      }
      __n = (long)pcVar3 - (long)ip_as_string;
      if (0x7f < (long)__n) {
        return -1;
      }
      memcpy(local_b8,ip_as_string,__n);
      local_b8[__n] = '\0';
      iVar2 = atoi(pcVar3 + 1);
      ip_as_string = local_b8;
      if (iVar2 - 0x10000U < 0xffff0001) {
        return -1;
      }
    }
    uStack_c8 = 0;
    uStack_d0 = 0;
    uStack_cc = 0;
    uVar1 = (ushort)iVar2 << 8 | (ushort)iVar2 >> 8;
    iVar2 = evutil_inet_pton(2,ip_as_string,&uStack_d0);
    iVar4 = -1;
    if ((iVar2 == 1) && (0xf < (long)*outlen)) {
      iVar4 = 0;
      memset(out + 1,0,(long)*outlen - 0x10);
      out->sa_family = 2;
      out->sa_data[0] = (char)uVar1;
      out->sa_data[1] = (char)(uVar1 >> 8);
      out->sa_data[2] = (char)uStack_d0;
      out->sa_data[3] = (char)((uint)uStack_d0 >> 8);
      out->sa_data[4] = (char)((uint)uStack_d0 >> 0x10);
      out->sa_data[5] = (char)((uint)uStack_d0 >> 0x18);
      *(ulong *)(out->sa_data + 6) = CONCAT44(uStack_c8,uStack_cc);
      *outlen = 0x10;
    }
  }
  return iVar4;
}

Assistant:

int
evutil_parse_sockaddr_port(const char *ip_as_string, struct sockaddr *out, int *outlen)
{
	int port;
	char buf[128];
	const char *cp, *addr_part, *port_part;
	int is_ipv6;
	/* recognized formats are:
	 * [ipv6]:port
	 * ipv6
	 * [ipv6]
	 * ipv4:port
	 * ipv4
	 */

	cp = strchr(ip_as_string, ':');
	if (*ip_as_string == '[') {
		size_t len;
		if (!(cp = strchr(ip_as_string, ']'))) {
			return -1;
		}
		len = ( cp-(ip_as_string + 1) );
		if (len > sizeof(buf)-1) {
			return -1;
		}
		memcpy(buf, ip_as_string+1, len);
		buf[len] = '\0';
		addr_part = buf;
		if (cp[1] == ':')
			port_part = cp+2;
		else
			port_part = NULL;
		is_ipv6 = 1;
	} else if (cp && strchr(cp+1, ':')) {
		is_ipv6 = 1;
		addr_part = ip_as_string;
		port_part = NULL;
	} else if (cp) {
		is_ipv6 = 0;
		if (cp - ip_as_string > (int)sizeof(buf)-1) {
			return -1;
		}
		memcpy(buf, ip_as_string, cp-ip_as_string);
		buf[cp-ip_as_string] = '\0';
		addr_part = buf;
		port_part = cp+1;
	} else {
		addr_part = ip_as_string;
		port_part = NULL;
		is_ipv6 = 0;
	}

	if (port_part == NULL) {
		port = 0;
	} else {
		port = atoi(port_part);
		if (port <= 0 || port > 65535) {
			return -1;
		}
	}

	if (!addr_part)
		return -1; /* Should be impossible. */
#ifdef AF_INET6
	if (is_ipv6)
	{
		struct sockaddr_in6 sin6;
		memset(&sin6, 0, sizeof(sin6));
#ifdef EVENT__HAVE_STRUCT_SOCKADDR_IN6_SIN6_LEN
		sin6.sin6_len = sizeof(sin6);
#endif
		sin6.sin6_family = AF_INET6;
		sin6.sin6_port = htons(port);
		if (1 != evutil_inet_pton(AF_INET6, addr_part, &sin6.sin6_addr))
			return -1;
		if ((int)sizeof(sin6) > *outlen)
			return -1;
		memset(out, 0, *outlen);
		memcpy(out, &sin6, sizeof(sin6));
		*outlen = sizeof(sin6);
		return 0;
	}
	else
#endif
	{
		struct sockaddr_in sin;
		memset(&sin, 0, sizeof(sin));
#ifdef EVENT__HAVE_STRUCT_SOCKADDR_IN_SIN_LEN
		sin.sin_len = sizeof(sin);
#endif
		sin.sin_family = AF_INET;
		sin.sin_port = htons(port);
		if (1 != evutil_inet_pton(AF_INET, addr_part, &sin.sin_addr))
			return -1;
		if ((int)sizeof(sin) > *outlen)
			return -1;
		memset(out, 0, *outlen);
		memcpy(out, &sin, sizeof(sin));
		*outlen = sizeof(sin);
		return 0;
	}
}